

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarRemoveTab(ImGuiTabBar *tab_bar,ImGuiID tab_id)

{
  ImGuiTabItem *pIVar1;
  long lVar2;
  long lVar3;
  
  if ((tab_id != 0) && (lVar2 = (long)(tab_bar->Tabs).Size, 0 < lVar2)) {
    pIVar1 = (tab_bar->Tabs).Data;
    lVar2 = lVar2 * 0x2c;
    lVar3 = 0;
    do {
      if (*(ImGuiID *)((long)&pIVar1->ID + lVar3) == tab_id) {
        memmove((void *)((long)&pIVar1->ID + lVar3),(void *)((long)&pIVar1[1].ID + lVar3),
                (lVar2 - lVar3) - 0x2c);
        (tab_bar->Tabs).Size = (tab_bar->Tabs).Size + -1;
        break;
      }
      lVar3 = lVar3 + 0x2c;
    } while (lVar2 - lVar3 != 0);
  }
  if (tab_bar->VisibleTabId == tab_id) {
    tab_bar->VisibleTabId = 0;
  }
  if (tab_bar->SelectedTabId == tab_id) {
    tab_bar->SelectedTabId = 0;
  }
  if (tab_bar->NextSelectedTabId == tab_id) {
    tab_bar->NextSelectedTabId = 0;
  }
  return;
}

Assistant:

void ImGui::TabBarRemoveTab(ImGuiTabBar* tab_bar, ImGuiID tab_id)
{
    if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
        tab_bar->Tabs.erase(tab);
    if (tab_bar->VisibleTabId == tab_id)      { tab_bar->VisibleTabId = 0; }
    if (tab_bar->SelectedTabId == tab_id)     { tab_bar->SelectedTabId = 0; }
    if (tab_bar->NextSelectedTabId == tab_id) { tab_bar->NextSelectedTabId = 0; }
}